

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

string * __thiscall
helics::RandomDropFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,RandomDropFilterOperation *this,string_view property)

{
  int iVar1;
  size_type __rlen;
  
  if (property._M_len == 4) {
    iVar1 = bcmp(property._M_str,"prob",4);
  }
  else {
    if (property._M_len != 8) goto LAB_00226f9c;
    iVar1 = bcmp(property._M_str,"dropprob",8);
  }
  if (iVar1 == 0) {
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (__return_storage_ptr__,vsnprintf,0x148,"%f",
               (this->dropProb).super___atomic_float<double>._M_fp);
    return __return_storage_ptr__;
  }
LAB_00226f9c:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string RandomDropFilterOperation::getString(std::string_view property)
{
    if ((property == "dropprob") || (property == "prob")) {
        return std::to_string(dropProb.load());
    }
    return FilterOperations::getString(property);
}